

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

Abc_Obj_t *
Abc_ExactBuildNode(word *pTruth,int nVars,int *pArrTimeProfile,Abc_Obj_t **pFanins,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t **ppAVar1;
  Vec_Ptr_t *p_00;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  char *pName;
  Abc_Obj_t *pObj_00;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  word *pwVar9;
  Abc_Obj_t *local_b8;
  Abc_Obj_t *local_b0;
  abctime timeStart;
  char *pSopCover;
  Vec_Ptr_t *pVStack_90;
  char pGateTruth [5];
  Vec_Ptr_t *pGates;
  Abc_Obj_t *pObj;
  char *p;
  int pNormalArrTime [8];
  int local_4c;
  int local_48;
  int nMaxArrival;
  int j;
  int i;
  char *pSol;
  Abc_Ntk_t *pNtk_local;
  Abc_Obj_t **pFanins_local;
  int *pArrTimeProfile_local;
  word *pwStack_18;
  int nVars_local;
  word *pTruth_local;
  
  _j = (char *)0x0;
  pSol = (char *)pNtk;
  pNtk_local = (Abc_Ntk_t *)pFanins;
  pFanins_local = (Abc_Obj_t **)pArrTimeProfile;
  pArrTimeProfile_local._4_4_ = nVars;
  pwStack_18 = pTruth;
  aVar5 = Abc_Clock();
  if (pArrTimeProfile_local._4_4_ == 0) {
    aVar6 = Abc_Clock();
    s_pSesStore->timeTotal = (aVar6 - aVar5) + s_pSesStore->timeTotal;
    if ((*pwStack_18 & 1) == 0) {
      local_b0 = Abc_NtkCreateNodeConst0((Abc_Ntk_t *)pSol);
    }
    else {
      local_b0 = Abc_NtkCreateNodeConst1((Abc_Ntk_t *)pSol);
    }
    pTruth_local = (word *)local_b0;
  }
  else if (pArrTimeProfile_local._4_4_ == 1) {
    aVar6 = Abc_Clock();
    s_pSesStore->timeTotal = (aVar6 - aVar5) + s_pSesStore->timeTotal;
    if ((*pwStack_18 & 1) == 0) {
      local_b8 = Abc_NtkCreateNodeBuf((Abc_Ntk_t *)pSol,*(Abc_Obj_t **)pNtk_local);
    }
    else {
      local_b8 = Abc_NtkCreateNodeInv((Abc_Ntk_t *)pSol,*(Abc_Obj_t **)pNtk_local);
    }
    pTruth_local = (word *)local_b8;
  }
  else {
    for (nMaxArrival = 0; nMaxArrival < pArrTimeProfile_local._4_4_; nMaxArrival = nMaxArrival + 1)
    {
      pNormalArrTime[(long)nMaxArrival + -2] = *(int *)((long)pFanins_local + (long)nMaxArrival * 4)
      ;
    }
    Abc_NormalizeArrivalTimes((int *)&p,pArrTimeProfile_local._4_4_,&local_4c);
    iVar3 = Ses_StoreGetEntry(s_pSesStore,pwStack_18,pArrTimeProfile_local._4_4_,(int *)&p,
                              (char **)&j);
    if (iVar3 == 0) {
      __assert_fail("Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb68,
                    "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
    }
    if (_j == (char *)0x0) {
      aVar6 = Abc_Clock();
      s_pSesStore->timeTotal = (aVar6 - aVar5) + s_pSesStore->timeTotal;
      pTruth_local = (word *)0x0;
    }
    else {
      if (*_j != pArrTimeProfile_local._4_4_) {
        __assert_fail("pSol[ABC_EXACT_SOL_NVARS] == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb6f,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      if (_j[1] != '\x01') {
        __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb70,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      pVStack_90 = Vec_PtrAlloc(pArrTimeProfile_local._4_4_ + _j[2]);
      pSopCover._6_1_ = 0x30;
      pSopCover._7_1_ = 0;
      for (nMaxArrival = 0; nMaxArrival < pArrTimeProfile_local._4_4_; nMaxArrival = nMaxArrival + 1
          ) {
        if (*(long *)(pNtk_local->nObjCounts + (long)nMaxArrival * 2 + -0x18) == 0) {
          __assert_fail("pFanins[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0xb79,
                        "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                       );
        }
        Vec_PtrPush(pVStack_90,*(void **)(pNtk_local->nObjCounts + (long)nMaxArrival * 2 + -0x18));
      }
      pObj = (Abc_Obj_t *)(_j + 3);
      for (nMaxArrival = 0; iVar3 = pArrTimeProfile_local._4_4_, p_00 = pVStack_90,
          nMaxArrival < _j[2]; nMaxArrival = nMaxArrival + 1) {
        pSopCover._5_1_ = (*(byte *)&pObj->pNtk & 1) + 0x30;
        pSopCover._4_1_ = (*(char *)&pObj->pNtk >> 1 & 1U) + 0x30;
        pSopCover._3_1_ = (*(char *)&pObj->pNtk >> 2 & 1U) + 0x30;
        if (*(char *)((long)&pObj->pNtk + 1) != '\x02') {
          __assert_fail("*p == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0xb86,
                        "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                       );
        }
        if ((nMaxArrival + 1 == (int)_j[2]) &&
           (iVar3 = Abc_LitIsCompl((int)*(char *)((long)&pObj->pNtk + 4)), iVar3 != 0)) {
          for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
            uVar2 = 0x30;
            if (*(char *)((long)&pSopCover + (long)local_48 + 3) == '0') {
              uVar2 = 0x31;
            }
            *(undefined1 *)((long)&pSopCover + (long)local_48 + 3) = uVar2;
          }
        }
        pName = Abc_SopFromTruthBin((char *)((long)&pSopCover + 3));
        pObj_00 = Abc_NtkCreateNode((Abc_Ntk_t *)pSol);
        if (pObj_00 == (Abc_Obj_t *)0x0) {
          __assert_fail("pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0xb90,
                        "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                       );
        }
        pcVar7 = Abc_SopRegister(*(Mem_Flex_t **)(pSol + 0x100),pName);
        (pObj_00->field_5).pData = pcVar7;
        Vec_PtrPush(pVStack_90,pObj_00);
        if (pName != (char *)0x0) {
          free(pName);
        }
        ppAVar1 = &pObj->pNtk;
        pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVStack_90,(int)*(char *)((long)&pObj->pNtk + 2));
        Abc_ObjAddFanin(pObj_00,pAVar8);
        pObj = (Abc_Obj_t *)((long)&pObj->pNtk + 4);
        pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pVStack_90,(int)*(char *)((long)ppAVar1 + 3));
        Abc_ObjAddFanin(pObj_00,pAVar8);
      }
      iVar4 = Abc_Lit2Var((int)*(char *)&pObj->pNtk);
      pwVar9 = (word *)Vec_PtrEntry(p_00,iVar3 + iVar4);
      Vec_PtrFree(pVStack_90);
      aVar6 = Abc_Clock();
      s_pSesStore->timeTotal = (aVar6 - aVar5) + s_pSesStore->timeTotal;
      pTruth_local = pwVar9;
    }
  }
  return (Abc_Obj_t *)pTruth_local;
}

Assistant:

Abc_Obj_t * Abc_ExactBuildNode( word * pTruth, int nVars, int * pArrTimeProfile, Abc_Obj_t ** pFanins, Abc_Ntk_t * pNtk )
{
    char * pSol = NULL;
    int i, j, nMaxArrival;
    int pNormalArrTime[8];
    char const * p;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * pGates;
    char pGateTruth[5];
    char * pSopCover;
    abctime timeStart = Abc_Clock();

    if ( nVars == 0 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    }
    if ( nVars == 1 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeInv(pNtk, pFanins[0]) : Abc_NtkCreateNodeBuf(pNtk, pFanins[0]);
    }

    for ( i = 0; i < nVars; ++i )
        pNormalArrTime[i] = pArrTimeProfile[i];
    Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );
    assert( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) );
    if ( !pSol )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return NULL;
    }

    assert( pSol[ABC_EXACT_SOL_NVARS] == nVars );
    assert( pSol[ABC_EXACT_SOL_NFUNC] == 1 );

    pGates = Vec_PtrAlloc( nVars + pSol[ABC_EXACT_SOL_NGATES] );
    pGateTruth[3] = '0';
    pGateTruth[4] = '\0';

    /* primary inputs */
    for ( i = 0; i < nVars; ++i )
    {
        assert( pFanins[i] );
        Vec_PtrPush( pGates, pFanins[i] );
    }

    /* gates */
    p = pSol + 3;
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NGATES]; ++i )
    {
        pGateTruth[2] = '0' + ( *p & 1 );
        pGateTruth[1] = '0' + ( ( *p >> 1 ) & 1 );
        pGateTruth[0] = '0' + ( ( *p >> 2 ) & 1 );
        ++p;

        assert( *p == 2 ); /* binary gate */
        ++p;

        /* invert truth table if we are last gate and inverted */
        if ( i + 1 == pSol[ABC_EXACT_SOL_NGATES] && Abc_LitIsCompl( *( p + 2 ) ) )
            for ( j = 0; j < 4; ++j )
                pGateTruth[j] = ( pGateTruth[j] == '0' ) ? '1' : '0';

        pSopCover = Abc_SopFromTruthBin( pGateTruth );
        pObj = Abc_NtkCreateNode( pNtk );
        assert( pObj );
        pObj->pData = Abc_SopRegister( (Mem_Flex_t*)pNtk->pManFunc, pSopCover );
        Vec_PtrPush( pGates, pObj );
        ABC_FREE( pSopCover );

        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
    }

    /* output */
    pObj = (Abc_Obj_t *)Vec_PtrEntry( pGates, nVars + Abc_Lit2Var( *p ) );

    Vec_PtrFree( pGates );

    s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
    return pObj;
}